

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcoli.c
# Opt level: O1

int fffr4i2(float *input,long ntodo,double scale,double zero,int nullcheck,short nullval,
           char *nullarray,int *anynull,short *output,int *status)

{
  float fVar1;
  ushort uVar2;
  char cVar3;
  short sVar4;
  long lVar5;
  double dVar6;
  
  if (nullcheck == 0) {
    if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
      if (0 < ntodo) {
        lVar5 = 0;
        do {
          dVar6 = (double)input[lVar5] * scale + zero;
          if (-32768.49 <= dVar6) {
            if (dVar6 <= 32767.49) {
              sVar4 = (short)(int)dVar6;
            }
            else {
              *status = -0xb;
              sVar4 = 0x7fff;
            }
          }
          else {
            *status = -0xb;
            sVar4 = -0x8000;
          }
          output[lVar5] = sVar4;
          lVar5 = lVar5 + 1;
        } while (ntodo != lVar5);
      }
    }
    else if (0 < ntodo) {
      lVar5 = 0;
      do {
        fVar1 = input[lVar5];
        if (-32768.49 <= fVar1) {
          if (fVar1 <= 32767.49) {
            sVar4 = (short)(int)fVar1;
          }
          else {
            *status = -0xb;
            sVar4 = 0x7fff;
          }
        }
        else {
          *status = -0xb;
          sVar4 = -0x8000;
        }
        output[lVar5] = sVar4;
        lVar5 = lVar5 + 1;
      } while (ntodo != lVar5);
    }
  }
  else if (((scale != 1.0) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
    if (0 < ntodo) {
      lVar5 = 0;
      do {
        uVar2 = *(ushort *)((long)input + lVar5 * 4 + 2);
        cVar3 = ((uVar2 & 0x7f80) == 0) * '\x02';
        if ((uVar2 & 0x7f80) == 0x7f80) {
          cVar3 = '\x01';
        }
        if (cVar3 == '\0') {
          dVar6 = (double)input[lVar5] * scale + zero;
          if (dVar6 < -32768.49) {
LAB_0014b974:
            *status = -0xb;
            output[lVar5] = -0x8000;
          }
          else if (32767.49 < dVar6) {
LAB_0014b990:
            *status = -0xb;
            output[lVar5] = 0x7fff;
          }
          else {
            output[lVar5] = (short)(int)dVar6;
          }
        }
        else if (cVar3 == '\x01') {
          *anynull = 1;
          if (nullcheck == 1) {
            output[lVar5] = nullval;
          }
          else {
            nullarray[lVar5] = '\x01';
          }
        }
        else {
          if (zero < -32768.49) goto LAB_0014b974;
          if (32767.49 < zero) goto LAB_0014b990;
          output[lVar5] = (short)(int)zero;
        }
        lVar5 = lVar5 + 1;
      } while (ntodo != lVar5);
    }
  }
  else if (0 < ntodo) {
    lVar5 = 0;
    do {
      uVar2 = *(ushort *)((long)input + lVar5 * 4 + 2);
      cVar3 = ((uVar2 & 0x7f80) == 0) * '\x02';
      if ((uVar2 & 0x7f80) == 0x7f80) {
        cVar3 = '\x01';
      }
      if (cVar3 == '\0') {
        fVar1 = input[lVar5];
        if (-32768.49 <= fVar1) {
          if (fVar1 <= 32767.49) {
            output[lVar5] = (short)(int)fVar1;
          }
          else {
            *status = -0xb;
            output[lVar5] = 0x7fff;
          }
        }
        else {
          *status = -0xb;
          output[lVar5] = -0x8000;
        }
      }
      else if (cVar3 == '\x01') {
        *anynull = 1;
        if (nullcheck == 1) {
          output[lVar5] = nullval;
        }
        else {
          nullarray[lVar5] = '\x01';
        }
      }
      else {
        output[lVar5] = 0;
      }
      lVar5 = lVar5 + 1;
    } while (ntodo != lVar5);
  }
  return *status;
}

Assistant:

int fffr4i2(float *input,         /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            short nullval,        /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
            short *output,        /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to NaN.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    double dvalue;
    short *sptr, iret;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero == 0.)      /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] < DSHRT_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = SHRT_MIN;
                }
                else if (input[ii] > DSHRT_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = SHRT_MAX;
                }
                else
                    output[ii] = (short) input[ii];
            }
        }
        else             /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                dvalue = input[ii] * scale + zero;

                if (dvalue < DSHRT_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = SHRT_MIN;
                }
                else if (dvalue > DSHRT_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = SHRT_MAX;
                }
                else
                    output[ii] = (short) dvalue;
            }
        }
    }
    else        /* must check for null values */
    {
        sptr = (short *) input;

#if BYTESWAPPED && MACHINE != VAXVMS && MACHINE != ALPHAVMS
        sptr++;       /* point to MSBs */
#endif

        if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++, sptr += 2)
            {
              if (0 != (iret = fnan(*sptr) ) )  /* test for NaN or underflow */
              {
                  if (iret == 1)  /* is it a NaN? */
                  {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                  }
                  else            /* it's an underflow */
                     output[ii] = 0;
              }
              else
                {
                    if (input[ii] < DSHRT_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = SHRT_MIN;
                    }
                    else if (input[ii] > DSHRT_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = SHRT_MAX;
                    }
                    else
                        output[ii] = (short) input[ii];
                }
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++, sptr += 2)
            {
              if (0 != (iret = fnan(*sptr) ) )  /* test for NaN or underflow */
              {
                  if (iret == 1)  /* is it a NaN? */
                  {  
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                  }
                  else            /* it's an underflow */
                  {
                    if (zero < DSHRT_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = SHRT_MIN;
                    }
                    else if (zero > DSHRT_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = SHRT_MAX;
                    }
                    else
                        output[ii] = (short) zero;
                  }
              }
              else
                {
                    dvalue = input[ii] * scale + zero;

                    if (dvalue < DSHRT_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = SHRT_MIN;
                    }
                    else if (dvalue > DSHRT_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = SHRT_MAX;
                    }
                    else
                        output[ii] = (short) dvalue;
                }
            }
        }
    }
    return(*status);
}